

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O0

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration
          (EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y,int Theta)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_stack_00000010;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_00000018;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_00000020;
  sbpl_xy_theta_pt_t in_stack_00000030;
  int y;
  int x;
  int find;
  int levind;
  sbpl_xy_theta_pt_t pose;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *__n;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *this_00;
  reference in_stack_ffffffffffffff30;
  int local_9c;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_ffffffffffffff68;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *in_stack_ffffffffffffff70;
  int local_60;
  sbpl_xy_theta_pt_t local_50;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar3 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                    ((EnvironmentNAVXYTHETALATTICE *)CONCAT44(in_ESI,in_EDX),in_ECX,
                     in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (bVar3) {
    std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
              ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x182009);
    sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_50);
    local_50.x = (double)in_ESI * *(double *)(in_RDI + 0xa0) + *(double *)(in_RDI + 0xa0) * 0.5;
    local_50.y = (double)in_EDX * *(double *)(in_RDI + 0xa0) + *(double *)(in_RDI + 0xa0) * 0.5;
    local_50.theta = DiscTheta2Cont(in_ECX,*(int *)(in_RDI + 0x30));
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x1e0); local_60 = local_60 + 1) {
      std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
                ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x1820cd);
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      __n = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)local_50.x;
      this_00 = (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)local_50.y;
      in_stack_ffffffffffffff68 = (vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)local_50.x;
      in_stack_ffffffffffffff70 =
           (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)local_50.y;
      get_2d_footprint_cells
                (in_stack_00000020,in_stack_00000018,in_stack_00000030,in_stack_00000010);
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_ffffffffffffff30);
      local_9c = 0;
      while( true ) {
        sVar4 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size
                          ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                           &stack0xffffffffffffffc8);
        if ((int)sVar4 <= local_9c) break;
        pvVar5 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                           (this_00,(size_type)__n);
        iVar1 = pvVar5->x;
        in_stack_ffffffffffffff30 =
             std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at(this_00,(size_type)__n);
        iVar2 = in_stack_ffffffffffffff30->y;
        if ((((iVar1 < 0) || (*(int *)(in_RDI + 0x28) <= iVar1)) || (iVar2 < 0)) ||
           ((*(int *)(in_RDI + 0x2c) <= iVar2 ||
            (*(byte *)(in_RDI + 0x88) <=
             *(byte *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x1f8) + (long)local_60 * 8) +
                                (long)iVar1 * 8) + (long)iVar2))))) {
          local_1 = false;
          goto LAB_001822a4;
        }
        local_9c = local_9c + 1;
      }
    }
    local_1 = true;
LAB_001822a4:
    std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector
              ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)in_stack_ffffffffffffff30);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration(int X, int Y, int Theta)
{
    //check the base footprint first
    if (!EnvironmentNAVXYTHETALAT::IsValidConfiguration(X, Y, Theta)) return false;

    //check the remaining levels now
    vector<sbpl_2Dcell_t> footprint;
    sbpl_xy_theta_pt_t pose;

    //compute continuous pose
    pose.x = DISCXY2CONT(X, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.y = DISCXY2CONT(Y, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.theta = DiscTheta2Cont(Theta, EnvNAVXYTHETALATCfg.NumThetaDirs);

    //iterate over additional levels
    for (int levind = 0; levind < numofadditionalzlevs; levind++) {

        //compute footprint cells
        footprint.clear();
        get_2d_footprint_cells(AddLevelFootprintPolygonV[levind], &footprint, pose, EnvNAVXYTHETALATCfg.cellsize_m);

        //iterate over all footprint cells
        for (int find = 0; find < (int)footprint.size(); find++) {
            int x = footprint.at(find).x;
            int y = footprint.at(find).y;

            if (x < 0 || x >= EnvNAVXYTHETALATCfg.EnvWidth_c || y < 0 || y >= EnvNAVXYTHETALATCfg.EnvHeight_c
                || AddLevelGrid2D[levind][x][y] >= EnvNAVXYTHETALATCfg.obsthresh) {
                return false;
            }
        }
    }

    return true;
}